

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::String::String(String *this,char *in)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = detail::my_strlen(in);
  __dest = (char *)malloc(sVar1 + 1);
  this->m_str = __dest;
  if (in != (char *)0x0) {
    strcpy(__dest,in);
    return;
  }
  *__dest = '\0';
  return;
}

Assistant:

String::String(const char* in)
        : m_str(static_cast<char*>(malloc(detail::my_strlen(in) + 1))) {
    if(in)
        strcpy(m_str, in);
    else
        m_str[0] = '\0';
}